

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O2

bool __thiscall ON_3dmRevisionHistory::Read(ON_3dmRevisionHistory *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int major_version;
  int minor_version;
  int local_18 [2];
  
  operator=(this,&Empty);
  local_18[0] = 0;
  local_18[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18,local_18 + 1);
  if ((bVar1) && (local_18[0] == 1)) {
    bVar1 = ON_BinaryArchive::ReadString(file,&this->m_sCreatedBy);
    if ((bVar1) &&
       (((bVar1 = ON_BinaryArchive::ReadTime(file,&this->m_create_time), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_sLastEditedBy), bVar1)) &&
        (bVar1 = ON_BinaryArchive::ReadTime(file,&this->m_last_edit_time), bVar1)))) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_revision_count);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_3dmRevisionHistory::Read( ON_BinaryArchive& file )
{
  *this = ON_3dmRevisionHistory::Empty;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 1 ) {
    rc = file.ReadString( m_sCreatedBy );
    if (rc) rc = file.ReadTime( m_create_time );
    if (rc) rc = file.ReadString( m_sLastEditedBy );
    if (rc) rc = file.ReadTime(m_last_edit_time );
    if (rc) rc = file.ReadInt( &m_revision_count );
  }
  return rc;
}